

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingCompressionState<unsigned_int,_true,_int>::Append
          (BitpackingCompressionState<unsigned_int,_true,_int> *this,UnifiedVectorFormat *vdata,
          idx_t count)

{
  uint *puVar1;
  idx_t iVar2;
  ulong in_RDX;
  UnifiedVectorFormat *in_RSI;
  BitpackingState<unsigned_int,_int> *in_RDI;
  idx_t idx;
  idx_t i;
  uint *data;
  undefined4 in_stack_ffffffffffffffc0;
  uint value;
  idx_t local_28;
  
  puVar1 = UnifiedVectorFormat::GetData<unsigned_int>(in_RSI);
  for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
    iVar2 = SelectionVector::get_index(in_RSI->sel,local_28);
    value = puVar1[iVar2];
    TemplatedValidityMask<unsigned_long>::RowIsValid
              ((TemplatedValidityMask<unsigned_long> *)in_RDI,
               CONCAT44(value,in_stack_ffffffffffffffc0));
    BitpackingState<unsigned_int,int>::
    Update<duckdb::BitpackingCompressionState<unsigned_int,true,int>::BitpackingWriter>
              (in_RDI,value,SUB41((uint)in_stack_ffffffffffffffc0 >> 0x18,0));
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);

		for (idx_t i = 0; i < count; i++) {
			idx_t idx = vdata.sel->get_index(i);
			state.template Update<BitpackingCompressionState<T, WRITE_STATISTICS, T_S>::BitpackingWriter>(
			    data[idx], vdata.validity.RowIsValid(idx));
		}
	}